

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UBool hasFullCompositionExclusion(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UBool UVar1;
  uint16_t norm16;
  Normalizer2Impl *this;
  bool local_29;
  Normalizer2Impl *impl;
  UProperty local_18;
  UErrorCode errorCode;
  UProperty param_2_local;
  UChar32 c_local;
  BinaryProperty *param_0_local;
  
  impl._4_4_ = U_ZERO_ERROR;
  local_18 = param_3;
  errorCode = c;
  _param_2_local = param_1;
  this = icu_63::Normalizer2Factory::getNFCImpl((UErrorCode *)((long)&impl + 4));
  UVar1 = U_SUCCESS(impl._4_4_);
  local_29 = false;
  if (UVar1 != '\0') {
    norm16 = icu_63::Normalizer2Impl::getNorm16(this,errorCode);
    UVar1 = icu_63::Normalizer2Impl::isCompNo(this,norm16);
    local_29 = UVar1 != '\0';
  }
  return local_29;
}

Assistant:

static UBool hasFullCompositionExclusion(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    // By definition, Full_Composition_Exclusion is the same as NFC_QC=No.
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    return U_SUCCESS(errorCode) && impl->isCompNo(impl->getNorm16(c));
}